

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

ull getbf(bitfield *bf,ull *a,ull *m,disctx *ctx)

{
  byte bVar1;
  ull uVar2;
  byte bVar3;
  int iVar4;
  ull uVar5;
  long lVar6;
  
  iVar4 = bf->shr;
  uVar5 = 0;
  for (lVar6 = 0; bVar3 = (byte)iVar4, lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar2 = bf_(bf->sbf[lVar6].pos,bf->sbf[lVar6].len,a,m);
    uVar5 = uVar5 | uVar2 << (bVar3 & 0x3f);
    iVar4 = iVar4 + bf->sbf[lVar6].len;
  }
  switch(bf->mode) {
  case BF_SIGNED:
    bVar1 = bVar3 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar5 >> ((ulong)(byte)(bVar3 - 1) & 0x3f) & 1) == 0) goto switchD_00169736_default;
    bVar1 = bVar3 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_00169736_caseD_3;
  case BF_LUT:
    uVar5 = bf->lut[uVar5];
  default:
    goto switchD_00169736_default;
  }
  if ((uVar5 >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
switchD_00169736_caseD_3:
    uVar5 = uVar5 + (-1L << (bVar3 & 0x3f));
  }
switchD_00169736_default:
  if (bf->pcrel != 0) {
    bVar3 = (byte)bf->shr;
    uVar5 = uVar5 + (((ulong)ctx->pos + bf->pospreadd >> (bVar3 & 0x3f)) << (bVar3 & 0x3f));
  }
  return (uVar5 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m, struct disctx *ctx) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	if (bf->pcrel) {
		// <3 xtensa.
		res += (ctx->pos + bf->pospreadd) & -(1ull << bf->shr);
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}